

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::allocate_WorkAndBaseArrays(HModel *this)

{
  size_type in_stack_00000008;
  
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  return;
}

Assistant:

void HModel::allocate_WorkAndBaseArrays() {
  // Allocate bounds and solution spaces
  workCost.resize(numTot);
  workDual.resize(numTot);
  //Was workShift.assign(numTot, 0); but shift is populated by call to initCost()
  workShift.resize(numTot);

  workLower.resize(numTot);
  workUpper.resize(numTot);
  workRange.resize(numTot);
  workValue.resize(numTot);

  baseLower.resize(numRow);
  baseUpper.resize(numRow);
  baseValue.resize(numRow);
}